

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

void __thiscall dg::pta::LLVMPointerGraphBuilder::PSNodesSeq::append(PSNodesSeq *this,PSNode *n)

{
  PSNode *local_8;
  
  local_8 = n;
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
            (&this->_nodes,&local_8);
  return;
}

Assistant:

void append(PSNode *n) { _nodes.push_back(n); }